

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9250.cpp
# Opt level: O3

bool __thiscall RTIMUMPU9250::resetFifo(RTIMUMPU9250 *this)

{
  bool bVar1;
  
  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'8'
                             ,'\0',"Writing int enable");
  if (bVar1) {
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               '#','\0',"Writing fifo enable");
    if (bVar1) {
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr
                                 ,'j','\0',"Writing user control");
      if (bVar1) {
        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                   this->m_slaveAddr,'j','\x04',"Resetting fifo");
        if (bVar1) {
          bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                     this->m_slaveAddr,'j','`',"Enabling the fifo");
          if (bVar1) {
            RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,0x32);
            bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_slaveAddr,'8','\x01',"Writing int enable");
            if (bVar1) {
              bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                         this->m_slaveAddr,'#','x',"Failed to set FIFO enables");
              return bVar1;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool RTIMUMPU9250::resetFifo()
{
    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_INT_ENABLE, 0, "Writing int enable"))
        return false;
    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_FIFO_EN, 0, "Writing fifo enable"))
        return false;
    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_USER_CTRL, 0, "Writing user control"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_USER_CTRL, 0x04, "Resetting fifo"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_USER_CTRL, 0x60, "Enabling the fifo"))
        return false;

    m_settings->delayMs(50);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_INT_ENABLE, 1, "Writing int enable"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9250_FIFO_EN, 0x78, "Failed to set FIFO enables"))
        return false;

    return true;
}